

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O0

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::transient_to_rrb<int,false,6>
          (immutable *this,ref<immutable::transient_rrb<int,_false,_6>_> *trrb)

{
  transient_rrb<int,_false,_6> *ptVar1;
  leaf_node<int,_false> *p;
  rrb<int,_false,_6> *p_00;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_20;
  ref<immutable::rrb_details::leaf_node<int,_false>_> leaf;
  ref<immutable::transient_rrb<int,_false,_6>_> *trrb_local;
  ref<immutable::rrb<int,_false,_6>_> *out;
  
  leaf.ptr = (leaf_node<int,_false> *)trrb;
  ptVar1 = ref<immutable::transient_rrb<int,_false,_6>_>::operator->(trrb);
  ptVar1->guid = 0;
  ptVar1 = ref<immutable::transient_rrb<int,_false,_6>_>::operator->
                     ((ref<immutable::transient_rrb<int,_false,_6>_> *)leaf.ptr);
  p = rrb_details::leaf_node_clone<int,false>((ptVar1->tail).ptr);
  ref<immutable::rrb_details::leaf_node<int,_false>_>::ref(&local_20,p);
  ptVar1 = ref<immutable::transient_rrb<int,_false,_6>_>::operator->
                     ((ref<immutable::transient_rrb<int,_false,_6>_> *)leaf.ptr);
  ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&ptVar1->tail,&local_20);
  p_00 = rrb_details::rrb_head_clone<int,false,6>(*(rrb<int,_false,_6> **)leaf.ptr);
  ref<immutable::rrb<int,_false,_6>_>::ref((ref<immutable::rrb<int,_false,_6>_> *)this,p_00);
  ref<immutable::rrb_details::leaf_node<int,_false>_>::~ref(&local_20);
  return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> transient_to_rrb(const ref<transient_rrb<T, atomic_ref_counting, N>>& trrb)
    {
    using namespace rrb_details;
    trrb->guid = 0;
    ref<leaf_node<T, atomic_ref_counting>> leaf = leaf_node_clone<T, atomic_ref_counting>(trrb->tail.ptr);
    trrb->tail = leaf;
    ref<rrb<T, atomic_ref_counting, N>> out = rrb_head_clone((const rrb<T, atomic_ref_counting, N>*)trrb.ptr);
    return out;
    }